

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O0

void __thiscall
arangodb::velocypack::Validator::validateIndexedObject(Validator *this,uint8_t *ptr,size_t length)

{
  undefined1 auVar1 [16];
  ValueLength VVar2;
  bool bVar3;
  undefined8 uVar4;
  ulong uVar5;
  int64_t iVar6;
  ValueLength VVar7;
  Exception *this_00;
  char *msg;
  byte bVar8;
  ulong in_RDX;
  byte *in_RSI;
  Validator *in_RDI;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar9;
  iterator i;
  ValueLength offset_2;
  ValueLength pos_1;
  ValueLength mid;
  bool found;
  ValueLength high;
  ValueLength low;
  ValueLength offset_1;
  ValueLength pos;
  ValueLength offset;
  uint8_t *value;
  ValueLength keySize;
  bool isSmallInt;
  bool isString;
  Slice key;
  uint8_t *member;
  ValueLength actualNrItems;
  unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  offsetSet;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> tableGuard;
  ValueLength *table;
  ValueLength tableBuf [16];
  uint8_t *e;
  uint8_t *p;
  uint8_t *firstMember;
  uint8_t *indexTable;
  ValueLength nrItems;
  ValueLength byteSize;
  ValueLength byteSizeLength;
  uint8_t head;
  _Node_iterator_base<unsigned_long,_false> in_stack_fffffffffffffd88;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_fffffffffffffd90;
  _Node_iterator_base<unsigned_long,_false> in_stack_fffffffffffffd98;
  ExceptionType type;
  Exception *in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffe28;
  size_t in_stack_fffffffffffffe30;
  uint8_t *in_stack_fffffffffffffe38;
  _Node_iterator_base<unsigned_long,_false> local_1a8;
  _Node_iterator_base<unsigned_long,_false> local_1a0;
  unsigned_long local_198;
  ulong local_190;
  ulong local_188;
  char local_179;
  ulong local_178;
  ulong local_170;
  unsigned_long local_168;
  ulong local_160;
  Slice local_158;
  _Node_iterator_base<unsigned_long,_false> local_150;
  undefined1 local_148;
  long local_140;
  byte *local_138;
  ValueLength local_130;
  byte local_122;
  byte local_121;
  Slice local_120;
  byte *local_118;
  ulong local_110;
  undefined1 *local_e0;
  undefined1 local_d8 [128];
  byte *local_58;
  byte *local_50;
  byte *local_48;
  byte *local_40;
  unsigned_long local_38;
  unsigned_long local_30;
  long local_28;
  byte local_19;
  ulong local_18;
  byte *local_10;
  
  local_19 = *in_RSI;
  if (local_19 < 0xf) {
    bVar8 = local_19 - 0xb;
  }
  else {
    bVar8 = local_19 - 0xf;
  }
  local_28 = 1L << (bVar8 & 0x3f);
  local_18 = in_RDX;
  local_10 = in_RSI;
  validateBufferLength
            ((Validator *)in_stack_fffffffffffffda0,(size_t)in_stack_fffffffffffffd98._M_cur,
             (size_t)in_stack_fffffffffffffd90,
             SUB81((ulong)in_stack_fffffffffffffd88._M_cur >> 0x38,0));
  local_30 = readIntegerNonEmpty<unsigned_long>
                       ((uint8_t *)in_stack_fffffffffffffd98._M_cur,
                        (ValueLength)in_stack_fffffffffffffd90);
  if (local_18 < local_30) {
    uVar4 = __cxa_allocate_exception(0x18);
    Exception::Exception
              (in_stack_fffffffffffffda0,
               (ExceptionType)((ulong)in_stack_fffffffffffffd98._M_cur >> 0x20),
               (char *)in_stack_fffffffffffffd90);
    __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
  }
  if ((local_19 == 0xe) || (local_19 == 0x12)) {
    local_38 = readIntegerNonEmpty<unsigned_long>
                         ((uint8_t *)in_stack_fffffffffffffd98._M_cur,
                          (ValueLength)in_stack_fffffffffffffd90);
    if (local_38 == 0) {
      uVar4 = __cxa_allocate_exception(0x18);
      Exception::Exception
                (in_stack_fffffffffffffda0,
                 (ExceptionType)((ulong)in_stack_fffffffffffffd98._M_cur >> 0x20),
                 (char *)in_stack_fffffffffffffd90);
      __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
    }
    local_40 = local_10 + ((local_30 - local_28) - local_38 * local_28);
    if ((local_40 < local_10 + local_28) || (local_10 + local_28 * -2 + local_18 < local_40)) {
      uVar4 = __cxa_allocate_exception(0x18);
      Exception::Exception
                (in_stack_fffffffffffffda0,
                 (ExceptionType)((ulong)in_stack_fffffffffffffd98._M_cur >> 0x20),
                 (char *)in_stack_fffffffffffffd90);
      __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
    }
    local_48 = local_10 + local_30;
  }
  else {
    local_38 = readIntegerNonEmpty<unsigned_long>
                         ((uint8_t *)in_stack_fffffffffffffd98._M_cur,
                          (ValueLength)in_stack_fffffffffffffd90);
    if (local_38 == 0) {
      uVar4 = __cxa_allocate_exception(0x18);
      Exception::Exception
                (in_stack_fffffffffffffda0,
                 (ExceptionType)((ulong)in_stack_fffffffffffffd98._M_cur >> 0x20),
                 (char *)in_stack_fffffffffffffd90);
      __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
    }
    local_50 = local_10 + local_28 * 2 + 1;
    local_58 = local_50 + local_28 * -2 + 8;
    if (local_10 + local_30 < local_58) {
      local_58 = local_10 + local_30;
    }
    while( true ) {
      bVar3 = false;
      if (local_50 < local_58) {
        bVar3 = *local_50 == 0;
      }
      if (!bVar3) break;
      local_50 = local_50 + 1;
    }
    if ((local_50 != local_10 + local_28 * 2 + 1) && (local_50 != local_10 + 9)) {
      uVar4 = __cxa_allocate_exception(0x18);
      Exception::Exception
                (in_stack_fffffffffffffda0,
                 (ExceptionType)((ulong)in_stack_fffffffffffffd98._M_cur >> 0x20),
                 (char *)in_stack_fffffffffffffd90);
      __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
    }
    local_40 = local_10 + (local_30 - local_38 * local_28);
    if (((local_40 < local_10 + local_28 * 2) || (local_40 < local_50)) ||
       (local_10 + (local_18 - local_28) < local_40)) {
      uVar4 = __cxa_allocate_exception(0x18);
      Exception::Exception
                (in_stack_fffffffffffffda0,
                 (ExceptionType)((ulong)in_stack_fffffffffffffd98._M_cur >> 0x20),
                 (char *)in_stack_fffffffffffffd90);
      __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
    }
    local_48 = local_50;
  }
  local_e0 = local_d8;
  std::unique_ptr<unsigned_long[],std::default_delete<unsigned_long[]>>::
  unique_ptr<std::default_delete<unsigned_long[]>,void>
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
             in_stack_fffffffffffffd90);
  std::
  unique_ptr<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,std::default_delete<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>>
  ::
  unique_ptr<std::default_delete<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>,void>
            ((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
              *)in_stack_fffffffffffffd90);
  if (0x10 < local_38) {
    if (local_38 < 0x81) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_38;
      uVar5 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      local_e0 = (undefined1 *)operator_new__(uVar5);
      std::unique_ptr<unsigned_long[],std::default_delete<unsigned_long[]>>::
      reset<unsigned_long*,void>
                ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                 in_stack_fffffffffffffd90,(unsigned_long *)in_stack_fffffffffffffd88._M_cur);
    }
    else {
      std::
      make_unique<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
                ();
      std::
      unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      ::operator=((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                   *)in_stack_fffffffffffffd90,
                  (unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                   *)in_stack_fffffffffffffd88._M_cur);
      std::
      unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      ::~unique_ptr((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     *)in_stack_fffffffffffffd90);
    }
  }
  local_110 = 0;
  local_118 = local_48;
  while (local_118 < local_40) {
    validatePart(in_RDI,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                 SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0));
    Slice::Slice(&local_120,local_118);
    local_121 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isString
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           0x134382);
    if ((!(bool)local_121) &&
       (((local_122 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                      isSmallInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                  *)0x1343a6), !(bool)local_122 &&
         (bVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isUInt
                            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                             0x1343c6), !bVar3)) ||
        (((local_122 & 1) != 0 &&
         (iVar6 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getSmallInt
                            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                             in_stack_fffffffffffffd98._M_cur), iVar6 < 1)))))) {
      type = (ExceptionType)((ulong)in_stack_fffffffffffffd98._M_cur >> 0x20);
      uVar4 = __cxa_allocate_exception(0x18);
      Exception::Exception(in_stack_fffffffffffffda0,type,(char *)in_stack_fffffffffffffd90);
      __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
    }
    local_130 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                          (in_stack_fffffffffffffd90);
    if (((local_121 & 1) != 0) && ((in_RDI->options->validateUtf8Strings & 1U) != 0)) {
      validatePart(in_RDI,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                   SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0));
    }
    local_138 = local_118 + local_130;
    if (local_40 <= local_138) {
      uVar4 = __cxa_allocate_exception(0x18);
      Exception::Exception
                (in_stack_fffffffffffffda0,
                 (ExceptionType)((ulong)in_stack_fffffffffffffd98._M_cur >> 0x20),
                 (char *)in_stack_fffffffffffffd90);
      __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
    }
    validatePart(in_RDI,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                 SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0));
    local_140 = (long)local_118 - (long)local_10;
    if (local_38 < 0x81) {
      *(long *)(local_e0 + local_110 * 8) = local_140;
    }
    else {
      std::
      unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      ::operator->((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                    *)0x13457e);
      pVar9 = std::
              unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
              ::emplace<unsigned_long&>
                        ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)in_stack_fffffffffffffda0,
                         (unsigned_long *)in_stack_fffffffffffffd98._M_cur);
      local_150._M_cur =
           (__node_type *)pVar9.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
      local_148 = pVar9.second;
    }
    VVar2 = local_130;
    Slice::Slice(&local_158,local_138);
    VVar7 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                      (in_stack_fffffffffffffd90);
    local_118 = local_118 + VVar2 + VVar7;
    local_110 = local_110 + 1;
    if (local_38 < local_110) {
      uVar4 = __cxa_allocate_exception(0x18);
      Exception::Exception
                (in_stack_fffffffffffffda0,
                 (ExceptionType)((ulong)in_stack_fffffffffffffd98._M_cur >> 0x20),
                 (char *)in_stack_fffffffffffffd90);
      __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
    }
  }
  if (local_110 < local_38) {
    uVar4 = __cxa_allocate_exception(0x18);
    Exception::Exception
              (in_stack_fffffffffffffda0,
               (ExceptionType)((ulong)in_stack_fffffffffffffd98._M_cur >> 0x20),
               (char *)in_stack_fffffffffffffd90);
    __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
  }
  if (local_38 < 0x81) {
    for (local_160 = 0; local_160 < local_38; local_160 = local_160 + 1) {
      local_168 = readIntegerNonEmpty<unsigned_long>
                            ((uint8_t *)in_stack_fffffffffffffd98._M_cur,
                             (ValueLength)in_stack_fffffffffffffd90);
      local_170 = 0;
      local_178 = local_38;
      local_179 = '\0';
      uVar5 = local_178;
      while (local_178 = uVar5, local_170 < local_178) {
        local_188 = local_170 + local_178 >> 1;
        if (local_168 == *(unsigned_long *)(local_e0 + local_188 * 8)) {
          local_179 = '\x01';
          break;
        }
        uVar5 = local_188;
        if (*(ulong *)(local_e0 + local_188 * 8) <= local_168) {
          local_170 = local_188 + 1;
          uVar5 = local_178;
        }
      }
      if (local_179 == '\0') {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        Exception::Exception
                  (this_00,(ExceptionType)((ulong)in_stack_fffffffffffffd98._M_cur >> 0x20),
                   (char *)in_stack_fffffffffffffd90);
        __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
      }
    }
  }
  else {
    for (local_190 = 0; local_190 < local_38; local_190 = local_190 + 1) {
      local_198 = readIntegerNonEmpty<unsigned_long>
                            ((uint8_t *)in_stack_fffffffffffffd98._M_cur,
                             (ValueLength)in_stack_fffffffffffffd90);
      std::
      unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      ::operator->((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                    *)0x1348b5);
      in_stack_fffffffffffffd98._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::find(in_stack_fffffffffffffd88._M_cur,(key_type *)0x1348c5);
      local_1a0._M_cur = in_stack_fffffffffffffd98._M_cur;
      std::
      unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      ::operator->((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                    *)0x1348e6);
      local_1a8._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::end(in_stack_fffffffffffffd88._M_cur);
      bVar3 = std::__detail::operator==(&local_1a0,&local_1a8);
      if (bVar3) {
        msg = (char *)__cxa_allocate_exception(0x18);
        Exception::Exception
                  (in_stack_fffffffffffffda0,
                   (ExceptionType)((ulong)in_stack_fffffffffffffd98._M_cur >> 0x20),msg);
        __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
      }
      std::
      unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      ::operator->((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                    *)0x13495e);
      in_stack_fffffffffffffd88._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::erase((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd98._M_cur);
    }
  }
  std::
  unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::~unique_ptr((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                 *)in_stack_fffffffffffffd90);
  std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
             in_stack_fffffffffffffda0);
  return;
}

Assistant:

void Validator::validateIndexedObject(uint8_t const* ptr, std::size_t length) {
  // Object with index table, with 1-8 bytes lengths
  uint8_t head = *ptr;
  ValueLength byteSizeLength;
  if (VELOCYPACK_UNLIKELY(head >= 0x0f)) {
    byteSizeLength = 1ULL << (static_cast<ValueLength>(head) - 0x0fU);
  } else {
    byteSizeLength = 1ULL << (static_cast<ValueLength>(head) - 0x0bU);
  }
  VELOCYPACK_ASSERT(byteSizeLength > 0);
  validateBufferLength(1 + byteSizeLength + byteSizeLength + 1, length, true);
  ValueLength const byteSize =
      readIntegerNonEmpty<ValueLength>(ptr + 1, byteSizeLength);

  if (byteSize > length) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Object length is out of bounds");
  }

  ValueLength nrItems;
  uint8_t const* indexTable;
  uint8_t const* firstMember;

  if (head == 0x0eU || head == 0x12U) {
    // byte length = 8
    nrItems = readIntegerNonEmpty<ValueLength>(ptr + byteSize - byteSizeLength,
                                               byteSizeLength);

    if (nrItems == 0) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object nrItems value is invalid");
    }

    indexTable = ptr + byteSize - byteSizeLength - (nrItems * byteSizeLength);
    if (indexTable < ptr + byteSizeLength ||
        indexTable > ptr + length - byteSizeLength - byteSizeLength) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object index table is out of bounds");
    }

    firstMember = ptr + byteSize;
  } else {
    // byte length = 1, 2 or 4
    nrItems = readIntegerNonEmpty<ValueLength>(ptr + 1 + byteSizeLength,
                                               byteSizeLength);

    if (nrItems == 0) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object nrItems value is invalid");
    }

    // look up first member
    uint8_t const* p = ptr + 1 + byteSizeLength + byteSizeLength;
    uint8_t const* e = p + (8 - byteSizeLength - byteSizeLength);
    if (e > ptr + byteSize) {
      e = ptr + byteSize;
    }
    while (p < e && *p == '\x00') {
      ++p;
    }

    // check if padding is correct
    if (p != ptr + 1 + byteSizeLength + byteSizeLength &&
        p != ptr + 1 + byteSizeLength + byteSizeLength +
                 (8 - byteSizeLength - byteSizeLength)) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object padding is invalid");
    }

    indexTable = ptr + byteSize - (nrItems * byteSizeLength);
    if (indexTable < ptr + byteSizeLength + byteSizeLength || indexTable < p ||
        indexTable > ptr + length - byteSizeLength) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object index table is out of bounds");
    }

    firstMember = p;
  }

  VELOCYPACK_ASSERT(nrItems > 0);

  ValueLength tableBuf[16];  // Fixed space to save offsets found sequentially
  ValueLength* table = tableBuf;
  std::unique_ptr<ValueLength[]> tableGuard;
  std::unique_ptr<std::unordered_set<ValueLength>> offsetSet;
  if (nrItems > 16) {
    if (nrItems <= 128) {
      table = new ValueLength[nrItems];  // throws if bad_alloc
      tableGuard.reset(table);           // for automatic deletion
    } else {
      // if we have even more items, we directly create an unordered_set
      offsetSet = std::make_unique<std::unordered_set<ValueLength>>();
    }
  }
  ValueLength actualNrItems = 0;
  uint8_t const* member = firstMember;
  while (member < indexTable) {
    validatePart(member, indexTable - member, true);

    Slice key(member);
    bool const isString = key.isString();
    if (!isString) {
      bool const isSmallInt = key.isSmallInt();
      if ((!isSmallInt && !key.isUInt()) ||
          (isSmallInt && key.getSmallInt() <= 0)) {
        throw Exception(Exception::ValidatorInvalidLength,
                        "Invalid object key type");
      }
    }

    ValueLength const keySize = key.byteSize();
    if (isString && options->validateUtf8Strings) {
      validatePart(member, keySize, true);
    }

    uint8_t const* value = member + keySize;
    if (value >= indexTable) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object value leaking into index table");
    }
    validatePart(value, indexTable - value, true);

    ValueLength offset = static_cast<ValueLength>(member - ptr);
    if (nrItems <= 128) {
      table[actualNrItems] = offset;
    } else {
      offsetSet->emplace(offset);
    }

    member += keySize + Slice(value).byteSize();
    ++actualNrItems;

    if (actualNrItems > nrItems) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object value has more key/value pairs than announced");
    }
  }

  if (actualNrItems < nrItems) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Object has fewer items than in index");
  }

  // Finally verify each offset in the index:
  if (nrItems <= 128) {
    for (ValueLength pos = 0; pos < nrItems; ++pos) {
      ValueLength offset = readIntegerNonEmpty<ValueLength>(
          indexTable + pos * byteSizeLength, byteSizeLength);
      // Binary search in sorted index list:
      ValueLength low = 0;
      ValueLength high = nrItems;
      bool found = false;
      while (low < high) {
        ValueLength mid = (low + high) / 2;
        if (offset == table[mid]) {
          found = true;
          break;
        } else if (offset < table[mid]) {
          high = mid;
        } else {  // offset > table[mid]
          low = mid + 1;
        }
      }
      if (!found) {
        throw Exception(Exception::ValidatorInvalidLength,
                        "Object has invalid index offset");
      }
    }
  } else {
    for (ValueLength pos = 0; pos < nrItems; ++pos) {
      ValueLength offset = readIntegerNonEmpty<ValueLength>(
          indexTable + pos * byteSizeLength, byteSizeLength);
      auto i = offsetSet->find(offset);
      if (i == offsetSet->end()) {
        throw Exception(Exception::ValidatorInvalidLength,
                        "Object has invalid index offset");
      }
      offsetSet->erase(i);
    }
  }
}